

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O0

void raw_check_close(Raw *raw)

{
  Raw *raw_local;
  
  if ((((raw->sent_console_eof & 1U) != 0) && ((raw->sent_socket_eof & 1U) != 0)) &&
     (raw->s != (Socket *)0x0)) {
    sk_close(raw->s);
    raw->s = (Socket *)0x0;
    seat_notify_remote_exit(raw->seat);
    seat_notify_remote_disconnect(raw->seat);
  }
  return;
}

Assistant:

static void raw_check_close(Raw *raw)
{
    /*
     * Called after we send EOF on either the socket or the console.
     * Its job is to wind up the session once we have sent EOF on both.
     */
    if (raw->sent_console_eof && raw->sent_socket_eof) {
        if (raw->s) {
            sk_close(raw->s);
            raw->s = NULL;
            seat_notify_remote_exit(raw->seat);
            seat_notify_remote_disconnect(raw->seat);
        }
    }
}